

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test::
TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test
          (TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test *this)

{
  TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockCallTest::TEST_GROUP_CppUTestGroupMockCallTest
            (&this->super_TEST_GROUP_CppUTestGroupMockCallTest);
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test_00354638
  ;
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherCallsExceptForTheUnExpectedOne)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().ignoreOtherCalls();
    mock().actualCall("bar").withParameter("foo", 1);
    mock().actualCall("bar1").withParameter("foo", 1);
    mock().actualCall("bar2").withParameter("foo", 1);
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}